

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrAtomic<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  byte bVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  unsigned_short uVar7;
  short sVar8;
  uint byteLength;
  int iVar9;
  uint uVar10;
  undefined4 *puVar11;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar12;
  undefined4 extraout_var;
  unsigned_short *puVar13;
  uint *puVar14;
  int *piVar15;
  long *buffer_00;
  short *psVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  byte *buffer;
  
  bVar4 = Wasm::Threads::IsEnabled();
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2356,"(Wasm::Threads::IsEnabled())","Wasm::Threads::IsEnabled()")
    ;
    if (!bVar4) goto LAB_00a617b7;
    *puVar11 = 0;
  }
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2357,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar4) goto LAB_00a617b7;
    *puVar11 = 0;
  }
  uVar10 = playout->Offset;
  uVar2 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  this_00 = GetWebAssemblyMemory(this);
  pAVar12 = WebAssemblyMemory::GetBuffer(this_00);
  byteLength = (*(pAVar12->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar12);
  iVar9 = (*(pAVar12->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar12);
  buffer = (byte *)CONCAT44(extraout_var,iVar9);
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
switchD_00a61543_caseD_6:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2367,"((0))","UNREACHED");
    if (bVar4) {
      *puVar11 = 0;
      return;
    }
LAB_00a617b7:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  uVar19 = (ulong)uVar2 + (ulong)uVar10;
  switch(playout->ViewType) {
  case TYPE_INT8:
    if (byteLength <= uVar19) {
LAB_00a617b9:
      JavascriptError::ThrowWebAssemblyRuntimeError
                (*(ScriptContext **)(this + 0x78),-0x7ff5e497,(PCWSTR)0x0);
    }
    cVar5 = AtomicsOperations::Load<char>((char *)(buffer + uVar19));
    bVar1 = playout->Value;
    uVar10 = (uint)cVar5;
    goto LAB_00a616f6;
  case TYPE_UINT8:
    if (byteLength <= uVar19) goto LAB_00a617b9;
    bVar6 = AtomicsOperations::Load<unsigned_char>(buffer + uVar19);
    bVar1 = playout->Value;
    uVar10 = (uint)bVar6;
LAB_00a616f6:
    uVar19 = (ulong)bVar1;
    lVar18 = *(long *)(this + 0x118);
    goto LAB_00a61701;
  case TYPE_INT16:
    psVar16 = WasmAtomicsArrayBoundsCheck<short>(this,buffer,uVar19,byteLength);
    sVar8 = AtomicsOperations::Load<short>(psVar16);
    uVar19 = (ulong)playout->Value;
    uVar10 = (uint)sVar8;
    goto LAB_00a616ce;
  case TYPE_UINT16:
    puVar13 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer,uVar19,byteLength);
    uVar7 = AtomicsOperations::Load<unsigned_short>(puVar13);
    uVar19 = (ulong)playout->Value;
    uVar10 = (uint)uVar7;
    goto LAB_00a616ce;
  case TYPE_INT32:
    piVar15 = WasmAtomicsArrayBoundsCheck<int>(this,buffer,uVar19,byteLength);
    uVar10 = AtomicsOperations::Load<int>(piVar15);
    goto LAB_00a615f8;
  case TYPE_UINT32:
    puVar14 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer,uVar19,byteLength);
    uVar10 = AtomicsOperations::Load<unsigned_int>(puVar14);
LAB_00a615f8:
    uVar19 = (ulong)playout->Value;
LAB_00a616ce:
    lVar18 = *(long *)(this + 0x118);
LAB_00a61701:
    *(uint *)(lVar18 + uVar19 * 4) = uVar10;
    return;
  default:
    goto switchD_00a61543_caseD_6;
  case TYPE_INT64:
    buffer_00 = WasmAtomicsArrayBoundsCheck<long>(this,buffer,uVar19,byteLength);
    uVar19 = AtomicsOperations::Load<long>(buffer_00);
    uVar17 = (ulong)playout->Value;
    break;
  case TYPE_INT8_TO_INT64:
    if (byteLength <= uVar19) goto LAB_00a617b9;
    cVar5 = AtomicsOperations::Load<char>((char *)(buffer + uVar19));
    bVar1 = playout->Value;
    uVar19 = (ulong)cVar5;
    goto LAB_00a61799;
  case TYPE_UINT8_TO_INT64:
    if (byteLength <= uVar19) goto LAB_00a617b9;
    bVar6 = AtomicsOperations::Load<unsigned_char>(buffer + uVar19);
    bVar1 = playout->Value;
    uVar19 = (ulong)bVar6;
LAB_00a61799:
    uVar17 = (ulong)bVar1;
    lVar18 = *(long *)(this + 0x120);
    goto LAB_00a617a4;
  case TYPE_INT16_TO_INT64:
    psVar16 = WasmAtomicsArrayBoundsCheck<short>(this,buffer,uVar19,byteLength);
    sVar8 = AtomicsOperations::Load<short>(psVar16);
    uVar17 = (ulong)playout->Value;
    uVar19 = (ulong)sVar8;
    break;
  case TYPE_UINT16_TO_INT64:
    puVar13 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer,uVar19,byteLength);
    uVar7 = AtomicsOperations::Load<unsigned_short>(puVar13);
    uVar17 = (ulong)playout->Value;
    uVar19 = (ulong)uVar7;
    break;
  case TYPE_INT32_TO_INT64:
    piVar15 = WasmAtomicsArrayBoundsCheck<int>(this,buffer,uVar19,byteLength);
    iVar9 = AtomicsOperations::Load<int>(piVar15);
    uVar17 = (ulong)playout->Value;
    uVar19 = (ulong)iVar9;
    break;
  case TYPE_UINT32_TO_INT64:
    puVar14 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer,uVar19,byteLength);
    uVar10 = AtomicsOperations::Load<unsigned_int>(puVar14);
    uVar17 = (ulong)playout->Value;
    uVar19 = (ulong)uVar10;
  }
  lVar18 = *(long *)(this + 0x120);
LAB_00a617a4:
  *(ulong *)(lVar18 + uVar17 * 8) = uVar19;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrAtomic(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(Wasm::Threads::IsEnabled());
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW_INT(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: {\
            MemType* readBuffer = WasmAtomicsArrayBoundsCheck<MemType>(buffer, index, byteLength); \
            MemType value = AtomicsOperations::Load<MemType>(readBuffer); \
            SetRegRaw<RegType>(playout->Value, (RegType)value); \
            return; \
        }
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }